

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O2

void __thiscall OpenMD::Equipartition::writeSequence(Equipartition *this)

{
  pointer pdVar1;
  char cVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  Revision r;
  string local_250;
  ofstream ofs;
  
  std::ofstream::ofstream
            (&ofs,(this->super_SequentialAnalyzer).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"Equipartition::writeSequence Error: failed to open %s\n",
             (this->super_SequentialAnalyzer).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).sequenceType_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_250,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_250);
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_250,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_250);
    poVar3 = std::operator<<((ostream *)&ofs,"# selection script1: \"");
    std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).selectionScript1_);
    if ((this->super_SequentialAnalyzer).paramString_._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_SequentialAnalyzer).paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<((ostream *)&ofs,"#time\t Tpx\t Tpy \t Tpz \t Tjx \t Tjy \t Tjz\n");
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      pdVar1 = (this->super_SequentialAnalyzer).times_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((ulong)((long)(this->super_SequentialAnalyzer).times_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar5) break;
      poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar5]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->TempP_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].super_Vector<double,_3U>.
                          data_[0]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->TempP_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].super_Vector<double,_3U>.
                          data_[1]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->TempP_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].super_Vector<double,_3U>.
                          data_[2]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->TempJ_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].super_Vector<double,_3U>.
                          data_[0]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->TempJ_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].super_Vector<double,_3U>.
                          data_[1]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->TempJ_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].super_Vector<double,_3U>.
                          data_[2]);
      std::operator<<(poVar3,"\n");
      uVar4 = uVar4 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void Equipartition::writeSequence() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getSequenceType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#time\t Tpx\t Tpy \t Tpz \t Tjx \t Tjy \t Tjz\n";

      for (unsigned int i = 0; i < times_.size(); ++i) {
        ofs << times_[i] << "\t" << TempP_[i].x() << "\t" << TempP_[i].y()
            << "\t" << TempP_[i].z() << "\t" << TempJ_[i].x() << "\t"
            << TempJ_[i].y() << "\t" << TempJ_[i].z() << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Equipartition::writeSequence Error: failed to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }